

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# locid.cpp
# Opt level: O1

int __thiscall
icu_63::KeywordEnumeration::clone
          (KeywordEnumeration *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  uint in_EAX;
  KeywordEnumeration *this_00;
  UErrorCode status;
  undefined8 uStack_18;
  
  uStack_18 = (ulong)in_EAX;
  this_00 = (KeywordEnumeration *)UMemory::operator_new((UMemory *)0xd0,(size_t)__fn);
  if (this_00 == (KeywordEnumeration *)0x0) {
    this_00 = (KeywordEnumeration *)0x0;
  }
  else {
    KeywordEnumeration(this_00,this->keywords,this->length,
                       *(int *)&this->current - (int)this->keywords,
                       (UErrorCode *)((long)&uStack_18 + 4));
  }
  return (int)this_00;
}

Assistant:

virtual StringEnumeration * clone() const
    {
        UErrorCode status = U_ZERO_ERROR;
        return new KeywordEnumeration(keywords, length, (int32_t)(current - keywords), status);
    }